

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void wake_nearby(void)

{
  uint uVar1;
  monst *pmVar2;
  int iVar3;
  
  for (pmVar2 = level->monlist; pmVar2 != (monst *)0x0; pmVar2 = pmVar2->nmon) {
    if (((0 < pmVar2->mhp) &&
        (iVar3 = dist2((int)pmVar2->mx,(int)pmVar2->my,(int)u.ux,(int)u.uy),
        SBORROW4(iVar3,u.ulevel * 0x14) != iVar3 + u.ulevel * -0x14 < 0)) &&
       (uVar1 = *(uint *)&pmVar2->field_0x60, *(uint *)&pmVar2->field_0x60 = uVar1 & 0xfff7ffff,
       (uVar1 >> 0x1a & 1) == 0 && pmVar2->mtame != '\0')) {
      *(uint *)&pmVar2[1].data = moves;
    }
  }
  return;
}

Assistant:

void wake_nearby(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (!DEADMONSTER(mtmp) && distu(mtmp->mx,mtmp->my) < u.ulevel*20) {
		mtmp->msleeping = 0;
		if (mtmp->mtame && !mtmp->isminion)
		    EDOG(mtmp)->whistletime = moves;
	    }
	}
}